

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

void fmt::v9::detail::convert_arg<void,fmt::v9::basic_printf_context<fmt::v9::appender,char>,char>
               (basic_format_arg<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *arg,
               char type)

{
  undefined1 value [16];
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  handle hVar1;
  basic_string_view<char> bVar2;
  char_type in_SIL;
  basic_format_arg<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *in_RDI;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  undefined2 in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef2;
  arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> local_d0;
  uint value_03;
  arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>
  *in_stack_ffffffffffffff50;
  unsigned_long_long in_stack_ffffffffffffff58;
  arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>
  *in_stack_ffffffffffffff60;
  void *in_stack_ffffffffffffff68;
  _func_void_void_ptr_parse_context_ptr_basic_printf_context<fmt::v9::appender,_char>_ptr *local_90;
  arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>
  *in_stack_ffffffffffffff78;
  size_t local_80;
  
  arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::arg_converter
            (&local_d0,in_RDI,in_SIL);
  value_03 = (uint)((ulong)in_RDI >> 0x20);
  switch(in_RDI->type_) {
  case none_type:
  default:
    monostate::monostate((monostate *)&stack0xffffffffffffff57);
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<fmt::v9::monostate,_0>(&local_d0);
    break;
  case int_type:
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::operator()<int,_0>
              (in_stack_ffffffffffffff50,value_03);
    break;
  case uint_type:
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<unsigned_int,_0>(in_stack_ffffffffffffff50,value_03);
    break;
  case long_long_type:
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<long_long,_0>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case ulong_long_type:
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<unsigned_long_long,_0>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case int128_type:
    value[7] = in_stack_fffffffffffffeef;
    value._0_7_ = in_stack_fffffffffffffee8;
    value._8_2_ = in_stack_fffffffffffffef0;
    value._10_6_ = in_stack_fffffffffffffef2;
    convert_for_visit<__int128>((__int128 *)(in_RDI->value_).field_0.string.data,(__int128)value);
    value_01._8_8_ = in_stack_ffffffffffffff68;
    value_01._0_8_ = in_stack_ffffffffffffff60;
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<__int128,_0>(in_stack_ffffffffffffff78,(__int128)value_01);
    break;
  case uint128_type:
    value_00[7] = in_stack_fffffffffffffeef;
    value_00._0_7_ = in_stack_fffffffffffffee8;
    value_00._8_2_ = in_stack_fffffffffffffef0;
    value_00._10_6_ = in_stack_fffffffffffffef2;
    convert_for_visit<unsigned__int128>
              ((unsigned___int128 *)(in_RDI->value_).field_0.string.data,
               (detail *)(in_RDI->value_).field_0.custom.format,(unsigned___int128)value_00);
    value_02._8_8_ = in_stack_ffffffffffffff68;
    value_02._0_8_ = in_stack_ffffffffffffff60;
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<unsigned___int128,_0>(in_stack_ffffffffffffff78,(unsigned___int128)value_02);
    break;
  case bool_type:
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::operator()
              ((arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *)
               CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0),
               (bool)in_stack_fffffffffffffeef);
    break;
  case char_type:
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<char,_0>(in_stack_ffffffffffffff50,(char)((ulong)in_RDI >> 0x38));
    break;
  case float_type:
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<float,_0>(&local_d0,(in_RDI->value_).field_0.float_value);
    break;
  case double_type:
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<double,_0>(&local_d0,(in_RDI->value_).field_0.double_value);
    break;
  case last_numeric_type:
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<long_double,_0>(&local_d0,(in_RDI->value_).field_0.long_double_value);
    break;
  case cstring_type:
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<const_char_*,_0>(&local_d0,(in_RDI->value_).field_0.string.data);
    break;
  case string_type:
    basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)&stack0xffffffffffffff78,
               (in_RDI->value_).field_0.string.data,(in_RDI->value_).field_0.string.size);
    bVar2.size_ = local_80;
    bVar2.data_ = (char *)in_stack_ffffffffffffff78;
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<fmt::v9::basic_string_view<char>,_0>(&local_d0,bVar2);
    break;
  case pointer_type:
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<const_void_*,_0>(&local_d0,(in_RDI->value_).field_0.pointer);
    break;
  case custom_type:
    basic_format_arg<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::handle::handle
              ((handle *)&stack0xffffffffffffff68,(in_RDI->value_).field_0.custom);
    hVar1.custom_.format = local_90;
    hVar1.custom_.value = in_stack_ffffffffffffff68;
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<fmt::v9::basic_format_arg<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::handle,_0>
              (&local_d0,hVar1);
  }
  return;
}

Assistant:

void convert_arg(basic_format_arg<Context>& arg, Char type) {
  visit_format_arg(arg_converter<T, Context>(arg, type), arg);
}